

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  ulong uVar1;
  Curl_easy *data;
  ENGINE *e;
  curl_ssl_ctx_callback p_Var2;
  _Bool _Var3;
  char cVar4;
  ssl_connect_state sVar5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  CURLcode CVar13;
  long lVar14;
  SSL_CIPHER *c;
  char *pcVar15;
  SSL_METHOD *meth;
  BIO *pBVar16;
  uint *puVar17;
  SSL_SESSION *ses;
  ulong uVar18;
  BIO_METHOD *pBVar19;
  SSL_CTX *pSVar20;
  BIO *pBVar21;
  X509 *pXVar22;
  X509_NAME *pXVar23;
  size_t sVar24;
  undefined8 uVar25;
  ASN1_INTEGER *pAVar26;
  ASN1_STRING *pAVar27;
  X509_EXTENSION *ex;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar28;
  X509 *pXVar29;
  GENERAL_NAMES *a_00;
  int *piVar30;
  uchar *puVar31;
  undefined8 extraout_RAX;
  undefined8 uVar32;
  X509_NAME_ENTRY *ne;
  ASN1_GENERALIZEDTIME *__s;
  PKCS12 *p12;
  size_t uznum;
  OCSP_RESPONSE *resp;
  FILE *pFVar33;
  OCSP_BASICRESP *bs;
  stack_st_X509 *certs;
  X509_STORE *pXVar34;
  OCSP_SINGLERESP *single;
  SSL *pSVar35;
  EVP_PKEY *pEVar36;
  evp_pkey_st *from;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  UI_METHOD *method;
  UI_METHOD *pUVar37;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Curl_easy *pCVar38;
  X509_PUBKEY *pXVar39;
  undefined7 uVar40;
  curl_socket_t writefd;
  X509_CINF *pXVar41;
  size_t size;
  size_t size_00;
  curl_socket_t readfd0;
  Curl_easy *pCVar42;
  BIGNUM *bn;
  char *pcVar43;
  connectdata *pcVar44;
  _Bool *p_Var45;
  long lVar46;
  X509_CINF *pXVar47;
  X509_CINF *pXVar48;
  bool bVar49;
  char *ptr;
  X509 *x509;
  X509_ALGOR *palg;
  ASN1_BIT_STRING *psig;
  BIGNUM *q;
  BIGNUM *iqmp;
  BIGNUM *dmq1;
  BIGNUM *dmp1;
  in6_addr addr;
  uchar protocols [128];
  ASN1_GENERALIZEDTIME *local_358;
  SSL_CTX *local_350;
  BIO *local_348;
  connectdata *local_340;
  X509 *local_338;
  Curl_easy *local_330;
  Curl_easy *local_328;
  BIO *local_320;
  X509 *local_318;
  X509_ALGOR *local_310;
  Curl_easy *local_308;
  int *local_300;
  _Bool *local_2f8;
  BIGNUM *local_2f0;
  X509 *local_2e8;
  long local_2e0;
  char *local_2d8;
  BIGNUM *local_2d0;
  BIGNUM *local_2c8;
  BIGNUM *local_2c0;
  ASN1_GENERALIZEDTIME *local_2b8 [16];
  EVP_PKEY *local_238;
  undefined1 uStack_230;
  undefined7 uStack_22f;
  char local_228 [496];
  undefined1 local_38 [8];
  
  lVar46 = (long)sockindex;
  if (conn->ssl[lVar46].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar38 = conn->data;
  local_308 = (Curl_easy *)CONCAT44(local_308._4_4_,conn->sock[lVar46]);
  sVar5 = conn->ssl[lVar46].connecting_state;
  pcVar44 = conn;
  local_340 = conn;
  p_Var45 = done;
  lVar14 = lVar46;
  if (sVar5 == ssl_connect_1) {
    lVar14 = Curl_timeleft(pCVar38,(timeval *)0x0,true);
    if (lVar14 < 0) {
LAB_00146ac1:
      Curl_failf(pCVar38,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    pCVar42 = conn->data;
    local_318 = (X509 *)CONCAT44(local_318._4_4_,conn->sock[lVar46]);
    Curl_ossl_seed(pCVar42);
    (pCVar42->set).ssl.certverifyresult = 1;
    lVar14 = (pCVar42->set).ssl.version;
    if (lVar14 == 2) {
      pcVar43 = "OpenSSL was built without SSLv2 support";
LAB_00146845:
      Curl_failf(pCVar42,pcVar43);
      return CURLE_NOT_BUILT_IN;
    }
    if (lVar14 == 3) {
      pcVar43 = "OpenSSL was built without SSLv3 support";
      goto LAB_00146845;
    }
    local_2f8 = done;
    local_2e0 = lVar46;
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar20 = (SSL_CTX *)conn->ssl[lVar46].ctx;
    if (pSVar20 != (SSL_CTX *)0x0) {
      SSL_CTX_free(pSVar20);
    }
    pSVar20 = SSL_CTX_new(meth);
    conn->ssl[lVar46].ctx = (SSL_CTX *)pSVar20;
    if (pSVar20 == (SSL_CTX *)0x0) {
      uVar18 = ERR_peek_error();
      pcVar43 = ERR_error_string(uVar18,(char *)0x0);
      Curl_failf(pCVar42,"SSL: couldn\'t create a context: %s",pcVar43);
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_CTX_ctrl(pSVar20,0x21,0x10,(void *)0x0);
    if (((pCVar42->set).fdebug != (curl_debug_callback)0x0) && ((pCVar42->set).verbose == true)) {
      SSL_CTX_set_msg_callback((SSL_CTX *)conn->ssl[lVar46].ctx,ssl_tls_trace);
      SSL_CTX_ctrl((SSL_CTX *)conn->ssl[lVar46].ctx,0x10,0,conn);
    }
    uVar18 = 0x80024850;
    if ((conn->data->set).ssl_enable_beast == false) {
      uVar18 = 0x80024050;
    }
    uVar1 = (pCVar42->set).ssl.version;
    if ((6 < uVar1) || ((0x7bU >> ((uint)uVar1 & 0x1f) & 1) == 0)) {
      Curl_failf(pCVar42,"Unsupported SSL protocol version");
      return CURLE_SSL_CONNECT_ERROR;
    }
    SSL_CTX_set_options(conn->ssl[lVar46].ctx,uVar18 | *(ulong *)(&DAT_00152d40 + uVar1 * 8));
    if ((conn->bits).tls_enable_npn == true) {
      SSL_CTX_set_next_proto_select_cb((SSL_CTX *)conn->ssl[lVar46].ctx,select_next_proto_cb,conn);
    }
    if ((conn->bits).tls_enable_alpn == true) {
      local_238._0_1_ = '\b';
      local_238._1_7_ = 0x2e312f70747468;
      uStack_230 = 0x31;
      Curl_infof(pCVar42,"ALPN, offering %s\n","http/1.1");
      SSL_CTX_set_alpn_protos(conn->ssl[lVar46].ctx,&local_238,9);
    }
    pBVar21 = (BIO *)(pCVar42->set).str[0];
    pBVar16 = (BIO *)(pCVar42->set).str[1];
    if (pBVar21 != (BIO *)0x0 || pBVar16 != (BIO *)0x0) {
      local_350 = (SSL_CTX *)conn->ssl[lVar46].ctx;
      local_320 = (BIO *)(pCVar42->set).str[0xb];
      local_328 = (Curl_easy *)(pCVar42->set).str[0xd];
      data = local_340->data;
      local_348 = pBVar21;
      iVar6 = do_file_type((char *)pBVar16);
      pSVar20 = local_350;
      if (iVar6 == 0x2a || local_348 != (BIO *)0x0) {
        pcVar43 = (data->set).str[0xc];
        if (pcVar43 != (char *)0x0) {
          SSL_CTX_set_default_passwd_cb_userdata(local_350,pcVar43);
          SSL_CTX_set_default_passwd_cb(pSVar20,passwd_callback);
        }
        if (iVar6 < 0x2a) {
          if (iVar6 == 1) {
            iVar6 = SSL_CTX_use_certificate_chain_file(pSVar20,(char *)local_348);
            bVar49 = true;
            if (iVar6 != 1) {
              uVar18 = ERR_get_error();
              pBVar16 = (BIO *)ERR_error_string(uVar18,(char *)0x0);
              pcVar43 = 
              "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
              ;
              goto LAB_00148450;
            }
          }
          else {
            if (iVar6 != 2) goto LAB_00147d44;
            iVar6 = SSL_CTX_use_certificate_file(pSVar20,(char *)local_348,2);
            bVar49 = true;
            if (iVar6 != 1) {
              uVar18 = ERR_get_error();
              pBVar16 = (BIO *)ERR_error_string(uVar18,(char *)0x0);
              pcVar43 = 
              "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
              ;
              goto LAB_00148450;
            }
          }
        }
        else {
          if (iVar6 != 0x2a) {
            if (iVar6 == 0x2b) {
              local_358 = (ASN1_GENERALIZEDTIME *)0x0;
              pFVar33 = fopen64((char *)local_348,"rb");
              if (pFVar33 == (FILE *)0x0) {
                pcVar43 = "could not open PKCS12 file \'%s\'";
                pBVar16 = local_348;
                goto LAB_00148450;
              }
              p12 = d2i_PKCS12_fp(pFVar33,(PKCS12 **)0x0);
              fclose(pFVar33);
              if (p12 == (PKCS12 *)0x0) {
                pcVar43 = "error reading PKCS12 file \'%s\'";
                pBVar16 = local_348;
                goto LAB_00148450;
              }
              PKCS12_PBE_add();
              iVar6 = PKCS12_parse(p12,(data->set).str[0xc],&local_238,&local_338,
                                   (stack_st_X509 **)&local_358);
              if (iVar6 == 0) {
                uVar18 = ERR_get_error();
                pcVar43 = ERR_error_string(uVar18,(char *)0x0);
                Curl_failf(data,"could not parse PKCS12 file, check password, OpenSSL error %s",
                           pcVar43);
                PKCS12_free(p12);
                return CURLE_SSL_CERTPROBLEM;
              }
              PKCS12_free(p12);
              iVar6 = SSL_CTX_use_certificate(pSVar20,local_338);
              if (iVar6 == 1) {
                iVar6 = SSL_CTX_use_PrivateKey
                                  (local_350,(EVP_PKEY *)CONCAT71(local_238._1_7_,(char)local_238));
                if (iVar6 == 1) {
                  iVar6 = SSL_CTX_check_private_key(local_350);
                  pSVar20 = local_350;
                  if (iVar6 != 0) {
                    if (local_358 != (ASN1_GENERALIZEDTIME *)0x0) {
                      do {
                        iVar6 = OPENSSL_sk_num(local_358);
                        if (iVar6 == 0) goto LAB_00148cf8;
                        pXVar22 = (X509 *)OPENSSL_sk_pop(local_358);
                        lVar14 = SSL_CTX_ctrl(pSVar20,0xe,0,pXVar22);
                        if (lVar14 == 0) {
                          X509_free(pXVar22);
                          pcVar43 = "cannot add certificate to certificate chain";
                          goto LAB_00148d3c;
                        }
                        iVar6 = SSL_CTX_add_client_CA(pSVar20,pXVar22);
                      } while (iVar6 != 0);
                      pcVar43 = "cannot add certificate to client CA list";
LAB_00148d3c:
                      Curl_failf(data,pcVar43);
                      goto LAB_00148cce;
                    }
LAB_00148cf8:
                    EVP_PKEY_free((EVP_PKEY *)CONCAT71(local_238._1_7_,(char)local_238));
                    X509_free(local_338);
                    OPENSSL_sk_pop_free(local_358,X509_free);
                    bVar49 = false;
                    pSVar20 = local_350;
                    goto LAB_00147d6e;
                  }
                  pcVar43 = 
                  "private key from PKCS12 file \'%s\' does not match certificate in same file";
                  pBVar21 = local_348;
                }
                else {
                  pcVar43 = "unable to use private key from PKCS12 file \'%s\'";
                  pBVar21 = local_348;
                }
              }
              else {
                uVar18 = ERR_get_error();
                pBVar21 = (BIO *)ERR_error_string(uVar18,(char *)0x0);
                pcVar43 = "could not load PKCS12 client certificate, OpenSSL error %s";
              }
              Curl_failf(data,pcVar43,pBVar21);
LAB_00148cce:
              EVP_PKEY_free((EVP_PKEY *)CONCAT71(local_238._1_7_,(char)local_238));
              X509_free(local_338);
              OPENSSL_sk_pop_free(local_358,X509_free);
              return CURLE_SSL_CERTPROBLEM;
            }
LAB_00147d44:
            pcVar43 = "not supported file type \'%s\' for certificate";
LAB_00148450:
            Curl_failf(data,pcVar43,pBVar16);
            return CURLE_SSL_CERTPROBLEM;
          }
          e = (ENGINE *)(data->state).engine;
          if (e == (ENGINE *)0x0) {
            pcVar43 = "crypto engine not set, can\'t load certificate";
            goto LAB_00148c79;
          }
          local_238._0_1_ = (char)local_348;
          local_238._1_7_ = (undefined7)((ulong)local_348 >> 8);
          uStack_230 = 0;
          uStack_22f = 0;
          iVar6 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
          if (iVar6 == 0) {
            pcVar43 = "ssl engine does not support loading certificates";
            goto LAB_00148c79;
          }
          iVar6 = ENGINE_ctrl_cmd((ENGINE *)(data->state).engine,"LOAD_CERT_CTRL",0,&local_238,
                                  (f *)0x0,1);
          if (iVar6 == 0) {
            uVar18 = ERR_get_error();
            pCVar38 = (Curl_easy *)ERR_error_string(uVar18,(char *)0x0);
            pcVar43 = "ssl engine cannot load client cert with id \'%s\' [%s]";
            pBVar21 = local_348;
            goto LAB_00148a3c;
          }
          if ((X509 *)CONCAT71(uStack_22f,uStack_230) == (X509 *)0x0) {
            pcVar43 = "ssl engine didn\'t initialized the certificate properly.";
            goto LAB_00148c79;
          }
          iVar6 = SSL_CTX_use_certificate(local_350,(X509 *)CONCAT71(uStack_22f,uStack_230));
          if (iVar6 != 1) {
            Curl_failf(data,"unable to set client certificate");
            X509_free((X509 *)CONCAT71(uStack_22f,uStack_230));
            return CURLE_SSL_CERTPROBLEM;
          }
          X509_free((X509 *)CONCAT71(uStack_22f,uStack_230));
          bVar49 = true;
          pSVar20 = local_350;
        }
LAB_00147d6e:
        iVar6 = do_file_type((char *)local_328);
        if (iVar6 < 0x2a) {
          pBVar21 = local_320;
          if (iVar6 == 1) {
            if (!bVar49) goto LAB_0014849b;
            if (local_320 == (BIO *)0x0) {
              pBVar21 = local_348;
            }
          }
          else if (iVar6 != 2) {
LAB_0014846b:
            pcVar43 = "not supported file type for private key";
            goto LAB_00148c79;
          }
          iVar6 = SSL_CTX_use_PrivateKey_file(pSVar20,(char *)pBVar21,iVar6);
          if (iVar6 != 1) {
            pCVar38 = (Curl_easy *)"PEM";
            if (local_328 != (Curl_easy *)0x0) {
              pCVar38 = local_328;
            }
            pcVar43 = "unable to set private key file: \'%s\' type %s";
LAB_00148a3c:
            Curl_failf(data,pcVar43,pBVar21,pCVar38);
            return CURLE_SSL_CERTPROBLEM;
          }
        }
        else if (iVar6 == 0x2a) {
          if ((data->state).engine == (ENGINE *)0x0) {
            pcVar43 = "crypto engine not set, can\'t load private key";
            goto LAB_00148c79;
          }
          method = UI_create_method("cURL user interface");
          if (method == (UI_METHOD *)0x0) {
            pcVar43 = "unable do create OpenSSL user-interface method";
            goto LAB_00148c79;
          }
          pUVar37 = UI_OpenSSL();
          iVar6 = UI_method_get_opener((UI *)pUVar37);
          UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar6));
          pUVar37 = UI_OpenSSL();
          iVar6 = UI_method_get_closer((UI *)pUVar37);
          UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar6));
          UI_method_set_reader(method,ssl_ui_reader);
          UI_method_set_writer(method,ssl_ui_writer);
          pEVar36 = ENGINE_load_private_key
                              ((ENGINE *)(data->state).engine,(char *)local_320,method,
                               (data->set).str[0xc]);
          UI_destroy_method(method);
          if (pEVar36 == (EVP_PKEY *)0x0) {
            pcVar43 = "failed to load private key from crypto engine";
            goto LAB_00148c79;
          }
          iVar6 = SSL_CTX_use_PrivateKey(local_350,pEVar36);
          if (iVar6 != 1) {
            Curl_failf(data,"unable to set private key");
            EVP_PKEY_free(pEVar36);
            return CURLE_SSL_CERTPROBLEM;
          }
          EVP_PKEY_free(pEVar36);
          pSVar20 = local_350;
        }
        else {
          if (iVar6 != 0x2b) goto LAB_0014846b;
          if (bVar49) {
            pcVar43 = "file type P12 for private key not supported";
            goto LAB_00148c79;
          }
        }
LAB_0014849b:
        pSVar35 = SSL_new(pSVar20);
        if (pSVar35 == (SSL *)0x0) {
          pcVar43 = "unable to create an SSL structure";
LAB_00148c79:
          Curl_failf(data,pcVar43);
          return CURLE_SSL_CERTPROBLEM;
        }
        local_338 = SSL_get_certificate(pSVar35);
        if (local_338 != (X509 *)0x0) {
          pEVar36 = X509_get_pubkey(local_338);
          from = SSL_get_privatekey(pSVar35);
          EVP_PKEY_copy_parameters(pEVar36,from);
          EVP_PKEY_free(pEVar36);
        }
        SSL_free(pSVar35);
        iVar6 = SSL_CTX_check_private_key(pSVar20);
        if (iVar6 == 0) {
          pcVar43 = "Private key does not match the certificate public key";
          goto LAB_00148c79;
        }
      }
    }
    pcVar43 = (pCVar42->set).str[0x17];
    pcVar15 = "ALL:!EXPORT:!EXPORT40:!EXPORT56:!aNULL:!LOW:!RC4:@STRENGTH";
    if (pcVar43 != (char *)0x0) {
      pcVar15 = pcVar43;
    }
    iVar6 = SSL_CTX_set_cipher_list((SSL_CTX *)conn->ssl[lVar46].ctx,pcVar15);
    if (iVar6 == 0) {
      Curl_failf(pCVar42,"failed setting cipher list: %s",pcVar15);
      return CURLE_SSL_CIPHER;
    }
    Curl_infof(pCVar42,"Cipher selection: %s\n",pcVar15);
    pcVar44 = local_340;
    pcVar43 = (pCVar42->set).str[0x14];
    pcVar15 = (pCVar42->set).str[0x15];
    if (pcVar15 != (char *)0x0 || pcVar43 != (char *)0x0) {
      iVar6 = SSL_CTX_load_verify_locations((SSL_CTX *)conn->ssl[lVar46].ctx,pcVar15,pcVar43);
      if (iVar6 == 0) {
        if ((pCVar42->set).ssl.verifypeer == true) {
          pcVar43 = (pCVar42->set).str[0x15];
          if (pcVar43 == (char *)0x0) {
            pcVar43 = "none";
          }
          pcVar15 = (pCVar42->set).str[0x14];
          if (pcVar15 == (char *)0x0) {
            pcVar15 = "none";
          }
          Curl_failf(pCVar42,
                     "error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s",
                     pcVar43,pcVar15);
          return CURLE_SSL_CACERT_BADFILE;
        }
        pcVar43 = "error setting certificate verify locations, continuing anyway:\n";
      }
      else {
        pcVar43 = "successfully set certificate verify locations:\n";
      }
      Curl_infof(pCVar42,pcVar43);
      pcVar43 = (pCVar42->set).str[0x15];
      if (pcVar43 == (char *)0x0) {
        pcVar43 = "none";
      }
      Curl_infof(pCVar42,"  CAfile: %s\n  CApath: %s\n",pcVar43);
    }
    if ((pCVar42->set).str[0x1b] != (char *)0x0) {
      pXVar34 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar46].ctx);
      m = X509_LOOKUP_file();
      ctx = X509_STORE_add_lookup(pXVar34,m);
      if ((ctx == (X509_LOOKUP *)0x0) ||
         (iVar6 = X509_load_crl_file(ctx,(pCVar42->set).str[0x1b],1), iVar6 == 0)) {
        Curl_failf(pCVar42,"error loading CRL file: %s",(pCVar42->set).str[0x1b]);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(pCVar42,"successfully load CRL file:\n");
      pXVar34 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar46].ctx);
      X509_STORE_set_flags(pXVar34,0xc);
      pcVar43 = (pCVar42->set).str[0x1b];
      pcVar15 = "none";
      if (pcVar43 != (char *)0x0) {
        pcVar15 = pcVar43;
      }
      Curl_infof(pCVar42,"  CRLfile: %s\n",pcVar15);
    }
    SSL_CTX_set_verify((SSL_CTX *)conn->ssl[lVar46].ctx,(uint)(pCVar42->set).ssl.verifypeer,
                       (callback *)0x0);
    p_Var2 = (pCVar42->set).ssl.fsslctx;
    if ((p_Var2 != (curl_ssl_ctx_callback)0x0) &&
       (CVar7 = (*p_Var2)(pCVar42,conn->ssl[lVar46].ctx,(pCVar42->set).ssl.fsslctxp),
       CVar7 != CURLE_OK)) {
      pcVar43 = "error signaled by ssl ctx callback";
      goto LAB_00146cbe;
    }
    pSVar35 = (SSL *)conn->ssl[lVar46].handle;
    if (pSVar35 != (SSL *)0x0) {
      SSL_free(pSVar35);
    }
    pSVar35 = SSL_new((SSL_CTX *)conn->ssl[lVar46].ctx);
    p_Var45 = local_2f8;
    conn->ssl[lVar46].handle = (SSL *)pSVar35;
    if (pSVar35 == (SSL *)0x0) {
      Curl_failf(pCVar42,"SSL: couldn\'t create a context (handle)!");
      return CURLE_OUT_OF_MEMORY;
    }
    if ((pCVar42->set).ssl.verifystatus == true) {
      SSL_ctrl(pSVar35,0x41,1,(void *)0x0);
      pSVar35 = (SSL *)conn->ssl[lVar46].handle;
    }
    SSL_set_connect_state(pSVar35);
    conn->ssl[lVar46].server_cert = (X509 *)0x0;
    iVar6 = inet_pton(2,(pcVar44->host).name,local_2b8);
    if (((iVar6 == 0) && (iVar6 = inet_pton(10,(pcVar44->host).name,local_2b8), iVar6 == 0)) &&
       (lVar14 = SSL_ctrl((SSL *)conn->ssl[lVar46].handle,0x37,0,(pcVar44->host).name), lVar14 == 0)
       ) {
      Curl_infof(pCVar42,"WARNING: failed to configure server name indication (SNI) TLS extension\n"
                );
    }
    if ((pcVar44->ssl_config).sessionid == true) {
      local_238._0_1_ = '\0';
      local_238._1_7_ = 0;
      Curl_ssl_sessionid_lock(pcVar44);
      _Var3 = Curl_ssl_getsessionid(pcVar44,&local_238,(size_t *)0x0);
      if (!_Var3) {
        iVar6 = SSL_set_session((SSL *)conn->ssl[lVar46].handle,
                                (SSL_SESSION *)CONCAT71(local_238._1_7_,(char)local_238));
        if (iVar6 == 0) {
          Curl_ssl_sessionid_unlock(pcVar44);
          uVar18 = ERR_get_error();
          pcVar43 = ERR_error_string(uVar18,(char *)0x0);
          pcVar15 = "SSL: SSL_set_session failed: %s";
          goto LAB_001489aa;
        }
        Curl_infof(pCVar42,"SSL re-using session ID\n");
      }
      Curl_ssl_sessionid_unlock(pcVar44);
      p_Var45 = local_2f8;
    }
    iVar6 = SSL_set_fd((SSL *)conn->ssl[lVar46].handle,(int)local_318);
    if (iVar6 == 0) {
      uVar18 = ERR_get_error();
      pcVar43 = ERR_error_string(uVar18,(char *)0x0);
      pcVar15 = "SSL: SSL_set_fd failed: %s";
LAB_001489aa:
      Curl_failf(pCVar42,pcVar15,pcVar43);
      return CURLE_SSL_CONNECT_ERROR;
    }
    conn->ssl[lVar46].connecting_state = ssl_connect_2;
    sVar5 = ssl_connect_2;
    lVar14 = local_2e0;
  }
  while (local_2e0 = lVar14, local_2f8 = p_Var45, sVar5 - ssl_connect_2 < 3) {
    lVar14 = Curl_timeleft(pCVar38,(timeval *)0x0,true);
    if (lVar14 < 0) goto LAB_00146ac1;
    sVar5 = conn->ssl[lVar46].connecting_state;
    if ((sVar5 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar5 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_308;
      }
      readfd0 = -1;
      if (sVar5 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_308;
      }
      if (nonblocking) {
        lVar14 = 0;
      }
      iVar6 = Curl_socket_check(readfd0,-1,writefd,lVar14);
      if (iVar6 < 0) {
        puVar17 = (uint *)__errno_location();
        Curl_failf(pCVar38,"select/poll on SSL socket, errno: %d",(ulong)*puVar17);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar6 == 0) {
        if (nonblocking) {
          *local_2f8 = false;
          return CURLE_OK;
        }
        goto LAB_00146ac1;
      }
    }
    pCVar42 = pcVar44->data;
    ERR_clear_error();
    iVar6 = SSL_connect((SSL *)conn->ssl[lVar46].handle);
    if (iVar6 == 1) {
      conn->ssl[lVar46].connecting_state = ssl_connect_3;
      pSVar35 = (SSL *)conn->ssl[lVar46].handle;
      pcVar43 = "";
      if (pSVar35 != (SSL *)0x0) {
        iVar6 = SSL_version(pSVar35);
        pcVar43 = "TLSv1.2";
        switch(iVar6) {
        case 0x300:
          pcVar43 = "SSLv3";
          break;
        case 0x301:
          pcVar43 = "TLSv1.0";
          break;
        case 0x302:
          pcVar43 = "TLSv1.1";
          break;
        case 0x303:
          break;
        default:
          if (iVar6 == 2) {
            pcVar43 = "SSLv2";
          }
          else {
            pcVar43 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)conn->ssl[lVar46].handle);
      pcVar15 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar42,"SSL connection using %s / %s\n",pcVar43,pcVar15);
      pcVar44 = local_340;
      if ((local_340->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected(conn->ssl[lVar46].handle,&local_238,local_2b8);
        if ((int)local_2b8[0] == 0) {
          Curl_infof(pCVar42,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar42,"ALPN, server accepted to use %.*s\n",(ulong)local_2b8[0] & 0xffffffff,
                     CONCAT71(local_238._1_7_,(char)local_238));
          if (((int)local_2b8[0] == 8) &&
             (*(long *)CONCAT71(local_238._1_7_,(char)local_238) == 0x312e312f70747468)) {
            pcVar44->negnpn = 2;
          }
        }
      }
    }
    else {
      iVar6 = SSL_get_error((SSL *)conn->ssl[lVar46].handle,iVar6);
      if (iVar6 == 3) {
        conn->ssl[lVar46].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (iVar6 != 2) {
          memset(&local_238,0,0x100);
          conn->ssl[lVar46].connecting_state = ssl_connect_2;
          uVar18 = ERR_get_error();
          uVar11 = (uint)uVar18;
          if ((((int)uVar11 < 0) || ((uVar11 & 0xff800000) != 0xa000000)) ||
             ((uVar11 & 0x7fffff) != 0x86)) {
            ERR_error_string_n(uVar18,(char *)&local_238,0x100);
            CVar7 = CURLE_SSL_CONNECT_ERROR;
            if (uVar18 == 0) {
              Curl_failf(pCVar42,"Unknown SSL protocol error in connection to %s:%ld ",
                         (pcVar44->host).name,(ulong)(uint)pcVar44->remote_port);
              return CURLE_SSL_CONNECT_ERROR;
            }
          }
          else {
            lVar46 = SSL_get_verify_result((SSL *)conn->ssl[lVar46].handle);
            if (lVar46 == 0) {
              builtin_strncpy(local_228,"verification failed",0x14);
              local_238._0_1_ = 'S';
              local_238._1_7_ = 0x74726563204c53;
              uStack_230 = 0x69;
              uStack_22f = 0x20657461636966;
            }
            else {
              pcVar43 = X509_verify_cert_error_string(lVar46);
              curl_msnprintf((char *)&local_238,0x100,"SSL certificate problem: %s",pcVar43);
            }
            CVar7 = CURLE_SSL_CACERT;
          }
          Curl_failf(pCVar42,"%s",&local_238);
          return CVar7;
        }
        conn->ssl[lVar46].connecting_state = ssl_connect_2_reading;
      }
    }
    sVar5 = conn->ssl[lVar46].connecting_state;
    p_Var45 = local_2f8;
    lVar14 = local_2e0;
    if ((nonblocking) && (sVar5 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar5 == ssl_connect_3) {
    pCVar42 = pcVar44->data;
    if ((pcVar44->ssl_config).sessionid == true) {
      local_238._0_1_ = '\0';
      local_238._1_7_ = 0;
      ses = SSL_get1_session((SSL *)conn->ssl[lVar46].handle);
      Curl_ssl_sessionid_lock(pcVar44);
      _Var3 = Curl_ssl_getsessionid(pcVar44,&local_238,(size_t *)0x0);
      if ((_Var3) || ((SSL_SESSION *)CONCAT71(local_238._1_7_,(char)local_238) == ses)) {
        if (_Var3) goto LAB_00146c98;
        SSL_SESSION_free(ses);
      }
      else {
        Curl_infof(pCVar42,"old SSL session ID is stale, removing\n");
        Curl_ssl_delsessionid(pcVar44,(void *)CONCAT71(local_238._1_7_,(char)local_238));
LAB_00146c98:
        CVar7 = Curl_ssl_addsessionid(pcVar44,ses,0);
        if (CVar7 != CURLE_OK) {
          Curl_ssl_sessionid_unlock(pcVar44);
          pcVar43 = "failed to store ssl session";
LAB_00146cbe:
          Curl_failf(pCVar42,pcVar43);
          return CVar7;
        }
      }
      Curl_ssl_sessionid_unlock(pcVar44);
    }
    cVar4 = '\x01';
    if ((pCVar42->set).ssl.verifypeer == false) {
      cVar4 = (pCVar42->set).ssl.verifyhost;
    }
    pCVar38 = pcVar44->data;
    pBVar19 = BIO_s_mem();
    local_2e8 = (X509 *)BIO_new(pBVar19);
    if ((pCVar38->set).ssl.certinfo == true) {
      pCVar42 = pcVar44->data;
      pSVar20 = (SSL_CTX *)SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar46].handle);
      if (pSVar20 != (SSL_CTX *)0x0) {
        local_350 = pSVar20;
        iVar6 = OPENSSL_sk_num(pSVar20);
        CVar7 = Curl_ssl_init_certinfo(pCVar42,iVar6);
        if (CVar7 == CURLE_OK) {
          local_330 = pCVar38;
          pBVar19 = BIO_s_mem();
          pBVar21 = BIO_new(pBVar19);
          local_328 = (Curl_easy *)CONCAT44(local_328._4_4_,iVar6);
          if (0 < iVar6) {
            iVar6 = 0;
            local_348 = pBVar21;
            local_308 = pCVar42;
            do {
              pXVar22 = (X509 *)OPENSSL_sk_value(local_350,iVar6);
              local_300 = (int *)0x0;
              pXVar23 = X509_get_subject_name(pXVar22);
              X509_NAME_print_ex(pBVar21,pXVar23,0,0x82031f);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
              Curl_ssl_push_certinfo_len(pCVar42,iVar6,"Subject",(char *)local_358,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              pXVar23 = X509_get_issuer_name(pXVar22);
              X509_NAME_print_ex(pBVar21,pXVar23,0,0x82031f);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
              Curl_ssl_push_certinfo_len(pCVar42,iVar6,"Issuer",(char *)local_358,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              uVar25 = X509_get_version(pXVar22);
              BIO_printf(pBVar21,"%lx",uVar25);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
              Curl_ssl_push_certinfo_len(pCVar42,iVar6,"Version",(char *)local_358,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              local_318 = pXVar22;
              pAVar26 = X509_get_serialNumber(pXVar22);
              if (pAVar26->type == 0x102) {
                BIO_puts(pBVar21,"-");
              }
              if (0 < pAVar26->length) {
                lVar14 = 0;
                do {
                  BIO_printf(pBVar21,"%02x",(ulong)pAVar26->data[lVar14]);
                  lVar14 = lVar14 + 1;
                } while (lVar14 < pAVar26->length);
              }
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
              pCVar42 = local_308;
              Curl_ssl_push_certinfo_len(local_308,iVar6,"Serial Number",(char *)local_358,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              local_310 = (X509_ALGOR *)0x0;
              pAVar27 = ASN1_STRING_new();
              if (pAVar27 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_300,&local_310,local_318);
                X509_signature_print(pBVar21,local_310,pAVar27);
                ASN1_STRING_free(pAVar27);
                if (local_310 != (X509_ALGOR *)0x0) {
                  i2a_ASN1_OBJECT(pBVar21,local_310->algorithm);
                  sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
                  Curl_ssl_push_certinfo_len
                            (pCVar42,iVar6,"Public Key Algorithm",(char *)local_358,sVar24);
                  BIO_ctrl(pBVar21,1,0,(void *)0x0);
                }
              }
              uVar25 = X509_get0_extensions(local_318);
              iVar8 = OPENSSL_sk_num(uVar25);
              if ((0 < iVar8) && (iVar8 = OPENSSL_sk_num(uVar25), 0 < iVar8)) {
                iVar8 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar25,iVar8);
                  pBVar19 = BIO_s_mem();
                  pBVar21 = BIO_new(pBVar19);
                  if (pBVar21 == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)local_2b8,0x80,a);
                  iVar9 = X509V3_EXT_print(pBVar21,ex,0,0);
                  if (iVar9 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(pBVar21,v);
                  }
                  BIO_ctrl(pBVar21,0x73,0,&local_338);
                  pXVar41 = local_338->cert_info;
                  if (pXVar41 != (X509_CINF *)0x0) {
                    pcVar43 = (char *)&local_238;
                    pXVar47 = (X509_CINF *)0x0;
                    pXVar22 = local_338;
                    do {
                      bVar49 = *(char *)((long)&pXVar22->sig_alg->algorithm + (long)pXVar47) == '\n'
                      ;
                      pcVar15 = "";
                      if (bVar49) {
                        pcVar15 = ", ";
                      }
                      pXVar47 = (X509_CINF *)((long)&pXVar47->version + (ulong)bVar49);
                      pXVar48 = pXVar47;
                      for (; pXVar47 < pXVar41; pXVar47 = (X509_CINF *)((long)&pXVar47->version + 1)
                          ) {
                        if (*(char *)((long)&pXVar22->sig_alg->algorithm + (long)pXVar47) != ' ') {
                          iVar9 = curl_msnprintf(pcVar43,(size_t)(local_38 + -(long)pcVar43),"%s%c",
                                                 pcVar15);
                          pcVar43 = pcVar43 + iVar9;
                          pXVar41 = local_338->cert_info;
                          pXVar22 = local_338;
                          pXVar48 = pXVar47;
                          break;
                        }
                        pXVar48 = pXVar41;
                      }
                      pXVar47 = (X509_CINF *)((long)&pXVar48->version + 1);
                    } while (pXVar47 < pXVar41);
                  }
                  pCVar42 = local_308;
                  Curl_ssl_push_certinfo(local_308,iVar6,(char *)local_2b8,(char *)&local_238);
                  BIO_free(pBVar21);
                  iVar8 = iVar8 + 1;
                  iVar9 = OPENSSL_sk_num(uVar25);
                } while (iVar8 < iVar9);
              }
              pXVar22 = local_318;
              pAVar28 = (ASN1_TIME *)X509_getm_notBefore(local_318);
              pBVar21 = local_348;
              ASN1_TIME_print(local_348,pAVar28);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
              Curl_ssl_push_certinfo_len(pCVar42,iVar6,"Start date",(char *)local_358,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              pAVar28 = (ASN1_TIME *)X509_getm_notAfter(pXVar22);
              ASN1_TIME_print(pBVar21,pAVar28);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
              Curl_ssl_push_certinfo_len(pCVar42,iVar6,"Expire date",(char *)local_358,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              pBVar21 = (BIO *)X509_get_pubkey(pXVar22);
              if (pBVar21 == (BIO *)0x0) {
                Curl_infof(pCVar42,"   Unable to load public key\n");
                pcVar44 = local_340;
              }
              else {
                iVar8 = EVP_PKEY_get_id(pBVar21);
                pcVar44 = local_340;
                if (iVar8 == 0x74) {
                  uVar25 = EVP_PKEY_get0_DSA(pBVar21);
                  local_320 = pBVar21;
                  DSA_get0_pqg(uVar25,&local_238,local_2b8,&local_338);
                  DSA_get0_key(uVar25,&local_2f0,&local_310);
                  pBVar16 = local_348;
                  pubkey_show(pCVar42,(BIO *)local_348,iVar6,"dsa","p",
                              (BIGNUM *)CONCAT71(local_238._1_7_,(char)local_238));
                  pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"dsa","q",(BIGNUM *)local_2b8[0]);
                  pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"dsa","g",(BIGNUM *)local_338);
                  pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"dsa","priv_key",(BIGNUM *)local_310);
                  pcVar43 = "dsa";
LAB_00147681:
                  pcVar15 = "pub_key";
                  bn = local_2f0;
LAB_00147688:
                  pBVar21 = local_320;
                  pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,pcVar43,pcVar15,bn);
                }
                else {
                  if (iVar8 == 0x1c) {
                    uVar25 = EVP_PKEY_get0_DH(pBVar21);
                    local_320 = pBVar21;
                    DH_get0_pqg(uVar25,&local_238,local_2b8,&local_338);
                    DH_get0_key(uVar25,&local_2f0,&local_310);
                    pBVar16 = local_348;
                    pubkey_show(pCVar42,(BIO *)local_348,iVar6,"dh","p",
                                (BIGNUM *)CONCAT71(local_238._1_7_,(char)local_238));
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"dh","q",(BIGNUM *)local_2b8[0]);
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"dh","g",(BIGNUM *)local_338);
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"dh","priv_key",(BIGNUM *)local_310);
                    pcVar43 = "dh";
                    goto LAB_00147681;
                  }
                  if (iVar8 == 6) {
                    uVar25 = EVP_PKEY_get0_RSA(pBVar21);
                    local_320 = pBVar21;
                    RSA_get0_key(uVar25,&local_238,local_2b8,&local_338);
                    RSA_get0_factors(uVar25,&local_310,&local_2f0);
                    RSA_get0_crt_params(uVar25,&local_2c0,&local_2c8,&local_2d0);
                    pBVar16 = local_348;
                    BN_print(local_348,(BIGNUM *)CONCAT71(local_238._1_7_,(char)local_238));
                    sVar24 = BIO_ctrl(pBVar16,3,0,&local_358);
                    Curl_ssl_push_certinfo_len
                              (pCVar42,iVar6,"RSA Public Key",(char *)local_358,sVar24);
                    BIO_ctrl(pBVar16,1,0,(void *)0x0);
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"rsa","n",
                                (BIGNUM *)CONCAT71(local_238._1_7_,(char)local_238));
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"rsa","e",(BIGNUM *)local_2b8[0]);
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"rsa","d",(BIGNUM *)local_338);
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"rsa","p",(BIGNUM *)local_310);
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"rsa","q",local_2f0);
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"rsa","dmp1",local_2c0);
                    pubkey_show(pCVar42,(BIO *)pBVar16,iVar6,"rsa","dmq1",local_2c8);
                    pcVar43 = "rsa";
                    pcVar15 = "iqmp";
                    bn = local_2d0;
                    goto LAB_00147688;
                  }
                }
                EVP_PKEY_free((EVP_PKEY *)pBVar21);
              }
              pBVar21 = local_348;
              if (local_300 != (int *)0x0) {
                if (0 < *local_300) {
                  lVar14 = 0;
                  do {
                    BIO_printf(pBVar21,"%02x:",(ulong)*(byte *)(*(long *)(local_300 + 2) + lVar14));
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < *local_300);
                }
                sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
                Curl_ssl_push_certinfo_len(pCVar42,iVar6,"Signature",(char *)local_358,sVar24);
                BIO_ctrl(pBVar21,1,0,(void *)0x0);
              }
              pBVar21 = local_348;
              PEM_write_bio_X509(local_348,local_318);
              sVar24 = BIO_ctrl(pBVar21,3,0,&local_358);
              Curl_ssl_push_certinfo_len(pCVar42,iVar6,"Cert",(char *)local_358,sVar24);
              BIO_ctrl(pBVar21,1,0,(void *)0x0);
              iVar6 = iVar6 + 1;
            } while (iVar6 != (int)local_328);
          }
          BIO_free(pBVar21);
          pCVar38 = local_330;
        }
      }
    }
    pXVar29 = (X509 *)SSL_get1_peer_certificate(conn->ssl[lVar46].handle);
    conn->ssl[lVar46].server_cert = pXVar29;
    if (pXVar29 != (X509 *)0x0) {
      pSVar20 = (SSL_CTX *)(pCVar38->state).buffer;
      Curl_infof(pCVar38,"Server certificate:\n");
      pXVar23 = X509_get_subject_name((X509 *)conn->ssl[lVar46].server_cert);
      iVar6 = x509_name_oneline((X509_NAME *)pXVar23,(char *)pSVar20,size);
      pcVar43 = "[NONE]";
      if (iVar6 == 0) {
        pcVar43 = (char *)pSVar20;
      }
      Curl_infof(pCVar38," subject: %s\n",pcVar43);
      pAVar28 = (ASN1_TIME *)X509_getm_notBefore(conn->ssl[lVar46].server_cert);
      pXVar22 = local_2e8;
      ASN1_TIME_print((BIO *)local_2e8,pAVar28);
      lVar14 = BIO_ctrl((BIO *)pXVar22,3,0,&local_2d8);
      Curl_infof(pCVar38," start date: %.*s\n",lVar14);
      BIO_ctrl((BIO *)pXVar22,1,0,(void *)0x0);
      pAVar28 = (ASN1_TIME *)X509_getm_notAfter(conn->ssl[lVar46].server_cert);
      ASN1_TIME_print((BIO *)pXVar22,pAVar28);
      lVar14 = BIO_ctrl((BIO *)pXVar22,3,0,&local_2d8);
      Curl_infof(pCVar38," expire date: %.*s\n",lVar14);
      BIO_ctrl((BIO *)pXVar22,1,0,(void *)0x0);
      BIO_free((BIO *)pXVar22);
      local_330 = pCVar38;
      if ((pCVar38->set).ssl.verifyhost != true) goto LAB_00147f25;
      pXVar22 = (X509 *)conn->ssl[lVar46].server_cert;
      local_328 = pcVar44->data;
      local_350 = pSVar20;
      if (((pcVar44->bits).ipv6_ip == true) &&
         (iVar6 = inet_pton(10,(pcVar44->host).name,&local_238), iVar6 != 0)) {
        iVar6 = 7;
        local_348 = (BIO *)0x10;
      }
      else {
        iVar6 = inet_pton(2,(pcVar44->host).name,&local_238);
        local_348 = (BIO *)(ulong)((uint)(iVar6 != 0) * 4);
        iVar6 = (uint)(iVar6 != 0) * 5 + 2;
      }
      uVar25 = 0;
      a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar22,0x55,(int *)0x0,(int *)0x0);
      if (a_00 != (GENERAL_NAMES *)0x0) {
        iVar8 = OPENSSL_sk_num(a_00);
        if (0 < iVar8) {
          local_318 = (X509 *)((ulong)local_318 & 0xffffffff00000000);
          local_308 = (Curl_easy *)((ulong)local_308 & 0xffffffff00000000);
          uVar32 = 0;
          iVar9 = 0;
          local_2e8 = pXVar22;
LAB_001479a4:
          local_320 = (BIO *)CONCAT44(local_320._4_4_,(int)uVar32);
          do {
            piVar30 = (int *)OPENSSL_sk_value(a_00,iVar9);
            iVar10 = *piVar30;
            uVar40 = (undefined7)((ulong)uVar25 >> 8);
            if (iVar10 == 2) {
              uVar25 = CONCAT71(uVar40,1);
              local_318 = (X509 *)CONCAT44(local_318._4_4_,(int)uVar25);
            }
            else if (iVar10 == 7) {
              uVar25 = CONCAT71(uVar40,1);
              local_308 = (Curl_easy *)CONCAT44(local_308._4_4_,(int)uVar25);
            }
            if (iVar10 == iVar6) {
              puVar31 = ASN1_STRING_data(*(ASN1_STRING **)(piVar30 + 2));
              iVar10 = ASN1_STRING_length(*(ASN1_STRING **)(piVar30 + 2));
              if (iVar6 == 7) {
                if ((local_348 == (BIO *)(long)iVar10) &&
                   (iVar10 = bcmp(puVar31,&local_238,(size_t)local_348), pcVar44 = local_340,
                   iVar10 == 0)) goto LAB_00147a53;
              }
              else if (((iVar6 == 2) &&
                       (pBVar21 = (BIO *)strlen((char *)puVar31), pBVar21 == (BIO *)(long)iVar10))
                      && (iVar10 = Curl_cert_hostcheck((char *)puVar31,(local_340->host).name),
                         pcVar44 = local_340, iVar10 != 0)) {
                Curl_infof(local_328," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                           (local_340->host).dispname);
                goto LAB_001483bc;
              }
            }
            iVar9 = iVar9 + 1;
            if (iVar8 <= iVar9) {
              GENERAL_NAMES_free(a_00);
              pCVar38 = local_328;
              pcVar44 = local_340;
              pSVar20 = local_350;
              if (((ulong)local_320 & 1) != 0) goto LAB_00147f25;
              pXVar22 = local_2e8;
              if ((((byte)local_318 | (byte)local_308) & 1) == 0) goto LAB_00147b06;
              Curl_infof(local_328," subjectAltName does not match %s\n",(local_340->host).dispname)
              ;
              Curl_failf(pCVar38,
                         "SSL: no alternative certificate subject name matches target host name \'%s\'"
                         ,(pcVar44->host).dispname);
              goto LAB_00147afb;
            }
          } while( true );
        }
        GENERAL_NAMES_free(a_00);
      }
LAB_00147b06:
      local_2b8[0] = (ASN1_GENERALIZEDTIME *)0x152ca8;
      pXVar23 = X509_get_subject_name(pXVar22);
      if (pXVar23 == (X509_NAME *)0x0) {
LAB_00147e66:
        pcVar44 = local_340;
        pSVar20 = local_350;
        if (local_2b8[0] == (ASN1_GENERALIZEDTIME *)0x152ca8) {
          local_2b8[0] = (ASN1_GENERALIZEDTIME *)0x0;
          goto LAB_00147ece;
        }
        if (local_2b8[0] == (ASN1_GENERALIZEDTIME *)0x0) goto LAB_00147ece;
        iVar6 = Curl_cert_hostcheck((char *)local_2b8[0],(local_340->host).name);
        if (iVar6 == 0) {
          Curl_failf(local_328,
                     "SSL: certificate subject name \'%s\' does not match target host name \'%s\'",
                     local_2b8[0]);
          CVar7 = CURLE_PEER_FAILED_VERIFICATION;
        }
        else {
          CVar7 = CURLE_OK;
          Curl_infof(local_328," common name: %s (matched)\n");
        }
      }
      else {
        iVar6 = -1;
        do {
          iVar8 = iVar6;
          iVar6 = X509_NAME_get_index_by_NID(pXVar23,0xd,iVar8);
        } while (-1 < iVar6);
        if (iVar8 < 0) goto LAB_00147e66;
        ne = X509_NAME_get_entry(pXVar23,iVar8);
        pAVar27 = X509_NAME_ENTRY_get_data(ne);
        if (pAVar27 == (ASN1_STRING *)0x0) goto LAB_00147e66;
        iVar6 = ASN1_STRING_type(pAVar27);
        if (iVar6 == 0xc) {
          uVar11 = ASN1_STRING_length(pAVar27);
          if ((int)uVar11 < 0) {
            __s = (ASN1_GENERALIZEDTIME *)0x152ca8;
          }
          else {
            __s = (ASN1_GENERALIZEDTIME *)
                  CRYPTO_malloc(uVar11 + 1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/lib/vtls/openssl.c"
                                ,0x4bd);
            local_2b8[0] = __s;
            if (__s == (ASN1_GENERALIZEDTIME *)0x0) goto LAB_00147ece;
            puVar31 = ASN1_STRING_data(pAVar27);
            memcpy(__s,puVar31,(ulong)uVar11);
            *(char *)((long)&__s->length + (ulong)uVar11) = '\0';
          }
LAB_00147e4d:
          uznum = strlen((char *)__s);
          uVar12 = curlx_uztosi(uznum);
          if (uVar12 == uVar11) goto LAB_00147e66;
          Curl_failf(local_328,"SSL: illegal cert name field");
          CVar7 = CURLE_PEER_FAILED_VERIFICATION;
          pSVar20 = local_350;
          pcVar44 = local_340;
          if (local_2b8[0] == (ASN1_GENERALIZEDTIME *)0x152ca8) {
LAB_00147afb:
            CVar7 = CURLE_PEER_FAILED_VERIFICATION;
            goto LAB_00147f0f;
          }
          goto LAB_00147ef4;
        }
        uVar11 = ASN1_STRING_to_UTF8((uchar **)local_2b8,pAVar27);
        __s = local_2b8[0];
        if (local_2b8[0] != (ASN1_GENERALIZEDTIME *)0x0) goto LAB_00147e4d;
LAB_00147ece:
        pSVar20 = local_350;
        Curl_failf(local_328,"SSL: unable to obtain common name from peer certificate");
        CVar7 = CURLE_PEER_FAILED_VERIFICATION;
        pcVar44 = local_340;
      }
LAB_00147ef4:
      if (local_2b8[0] != (ASN1_GENERALIZEDTIME *)0x0) {
        CRYPTO_free(local_2b8[0]);
      }
      if (CVar7 != CURLE_OK) {
LAB_00147f0f:
        X509_free((X509 *)conn->ssl[lVar46].server_cert);
        conn->ssl[lVar46].server_cert = (X509 *)0x0;
        return CVar7;
      }
      goto LAB_00147f25;
    }
    if (cVar4 != '\0') {
      Curl_failf(pCVar38,"SSL: couldn\'t get peer certificate!");
      return CURLE_PEER_FAILED_VERIFICATION;
    }
  }
  else if (sVar5 != ssl_connect_done) {
    _Var3 = false;
    goto LAB_00146b5e;
  }
LAB_0014680a:
  conn->ssl[lVar46].state = ssl_connection_complete;
  pcVar44->recv[local_2e0] = ossl_recv;
  pcVar44->send[local_2e0] = ossl_send;
  _Var3 = true;
LAB_00146b5e:
  *local_2f8 = _Var3;
  conn->ssl[lVar46].connecting_state = ssl_connect_1;
  return CURLE_OK;
LAB_00147a53:
  Curl_infof(local_328," subjectAltName: host \"%s\" matched cert\'s IP address!\n",
             (local_340->host).dispname);
  iVar9 = iVar9 + 1;
  uVar32 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  if (iVar8 <= iVar9) goto LAB_001483bc;
  goto LAB_001479a4;
LAB_001483bc:
  GENERAL_NAMES_free(a_00);
  pSVar20 = local_350;
LAB_00147f25:
  pXVar23 = X509_get_issuer_name((X509 *)conn->ssl[lVar46].server_cert);
  iVar6 = x509_name_oneline((X509_NAME *)pXVar23,(char *)pSVar20,size_00);
  pCVar38 = local_330;
  if (iVar6 == 0) {
    Curl_infof(local_330," issuer: %s\n",pSVar20);
    pcVar43 = (pCVar38->set).str[0x1c];
    if (pcVar43 != (char *)0x0) {
      pFVar33 = fopen64(pcVar43,"r");
      if (pFVar33 == (FILE *)0x0) {
        if (cVar4 != '\0') {
          Curl_failf(pCVar38,"SSL: Unable to open issuer cert (%s)",(pCVar38->set).str[0x1c]);
        }
        pXVar22 = (X509 *)conn->ssl[lVar46].server_cert;
LAB_001480f4:
        X509_free(pXVar22);
        conn->ssl[lVar46].server_cert = (X509 *)0x0;
        return CURLE_SSL_ISSUER_ERROR;
      }
      pXVar22 = PEM_read_X509(pFVar33,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (pXVar22 == (X509 *)0x0) {
        if (cVar4 != '\0') {
          Curl_failf(local_330,"SSL: Unable to read issuer cert (%s)",(local_330->set).str[0x1c]);
        }
        X509_free((X509 *)conn->ssl[lVar46].server_cert);
        X509_free((X509 *)0x0);
        fclose(pFVar33);
        return CURLE_SSL_ISSUER_ERROR;
      }
      fclose(pFVar33);
      iVar6 = X509_check_issued(pXVar22,(X509 *)conn->ssl[lVar46].server_cert);
      pCVar38 = local_330;
      if (iVar6 != 0) {
        if (cVar4 != '\0') {
          Curl_failf(local_330,"SSL: Certificate issuer check failed (%s)",
                     (local_330->set).str[0x1c]);
        }
        X509_free((X509 *)conn->ssl[lVar46].server_cert);
        goto LAB_001480f4;
      }
      Curl_infof(local_330," SSL certificate issuer check ok (%s)\n",(local_330->set).str[0x1c]);
      X509_free(pXVar22);
    }
    lVar14 = SSL_get_verify_result((SSL *)conn->ssl[lVar46].handle);
    (pCVar38->set).ssl.certverifyresult = lVar14;
    if (lVar14 == 0) {
      CVar7 = CURLE_OK;
      Curl_infof(pCVar38," SSL certificate verify ok.\n");
    }
    else if ((pCVar38->set).ssl.verifypeer == true) {
      CVar7 = CURLE_PEER_FAILED_VERIFICATION;
      pCVar38 = local_330;
      if (cVar4 != '\0') {
        pcVar43 = X509_verify_cert_error_string(lVar14);
        pCVar38 = local_330;
        Curl_failf(local_330,"SSL certificate verify result: %s (%ld)",pcVar43,lVar14);
      }
    }
    else {
      pcVar43 = X509_verify_cert_error_string(lVar14);
      CVar7 = CURLE_OK;
      Curl_infof(pCVar38," SSL certificate verify result: %s (%ld), continuing anyway.\n",pcVar43,
                 lVar14);
    }
  }
  else {
    CVar7 = CURLE_SSL_CONNECT_ERROR;
    if (cVar4 != '\0') {
      Curl_failf(local_330,"SSL: couldn\'t get X509-issuer name!");
    }
  }
  if ((pCVar38->set).ssl.verifystatus == true) {
    pCVar38 = pcVar44->data;
    lVar14 = SSL_ctrl((SSL *)conn->ssl[lVar46].handle,0x46,0,&local_238);
    if (CONCAT71(local_238._1_7_,(char)local_238) == 0) {
      pcVar43 = "No OCSP response received";
LAB_001480a1:
      resp = (OCSP_RESPONSE *)0x0;
LAB_001480a4:
      Curl_failf(pCVar38,pcVar43);
LAB_001480ae:
      OCSP_RESPONSE_free(resp);
      CVar13 = CURLE_SSL_INVALIDCERTSTATUS;
    }
    else {
      resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&local_238,lVar14);
      if (resp == (OCSP_RESPONSE *)0x0) {
        pcVar43 = "Invalid OCSP response";
        goto LAB_001480a1;
      }
      uVar11 = OCSP_response_status(resp);
      if (uVar11 != 0) {
        pcVar43 = OCSP_response_status_str((long)(int)uVar11);
        Curl_failf(pCVar38,"Invalid OCSP response status: %s (%d)",pcVar43,(ulong)uVar11);
        goto LAB_001480ae;
      }
      bs = OCSP_response_get1_basic(resp);
      if (bs == (OCSP_BASICRESP *)0x0) {
        pcVar43 = "Invalid OCSP response";
        goto LAB_001480a4;
      }
      certs = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar46].handle);
      pXVar34 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar46].ctx);
      iVar6 = OCSP_basic_verify(bs,certs,pXVar34,0);
      if (iVar6 < 1) {
        bVar49 = false;
        Curl_failf(pCVar38,"OCSP response verification failed");
        CVar13 = CURLE_SSL_INVALIDCERTSTATUS;
      }
      else {
        iVar6 = OCSP_resp_count(bs);
        if (0 < iVar6) {
          iVar6 = 0;
          do {
            single = OCSP_resp_get0(bs,iVar6);
            if (single != (OCSP_SINGLERESP *)0x0) {
              uVar11 = OCSP_single_get0_status
                                 (single,(int *)&local_300,local_2b8,
                                  (ASN1_GENERALIZEDTIME **)&local_338,&local_358);
              iVar8 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)local_338,local_358,300,-1);
              if (iVar8 == 0) {
                Curl_failf(pCVar38,"OCSP response has expired");
              }
              else {
                pcVar43 = OCSP_cert_status_str((long)(int)uVar11);
                Curl_infof(pCVar38,"SSL certificate status: %s (%d)\n",pcVar43,(ulong)uVar11);
                if (uVar11 != 2) {
                  pcVar44 = local_340;
                  if (uVar11 != 1) goto LAB_00148227;
                  pcVar43 = OCSP_crl_reason_str((long)(int)local_300);
                  Curl_failf(pCVar38,"SSL certificate revocation reason: %s (%d)",pcVar43,
                             (ulong)local_300 & 0xffffffff);
                }
              }
              CVar13 = CURLE_SSL_INVALIDCERTSTATUS;
              bVar49 = false;
              pcVar44 = local_340;
              goto LAB_00148ac5;
            }
LAB_00148227:
            iVar6 = iVar6 + 1;
            iVar8 = OCSP_resp_count(bs);
          } while (iVar6 < iVar8);
        }
        CVar13 = CURLE_OK;
        bVar49 = true;
      }
LAB_00148ac5:
      OCSP_BASICRESP_free(bs);
      OCSP_RESPONSE_free(resp);
      CVar7 = CURLE_OK;
      pCVar38 = local_330;
      if (bVar49) goto LAB_00148ae7;
    }
    X509_free((X509 *)conn->ssl[lVar46].server_cert);
    conn->ssl[lVar46].server_cert = (X509 *)0x0;
  }
  else {
LAB_00148ae7:
    CVar13 = CURLE_OK;
    if (cVar4 != '\0') {
      CVar13 = CVar7;
    }
    pcVar43 = (pCVar38->set).str[0x16];
    local_2d8 = pcVar43;
    if (pcVar43 != (char *)0x0 && CVar13 == CURLE_OK) {
      pXVar29 = conn->ssl[lVar46].server_cert;
      if (pXVar29 == (X509 *)0x0) {
LAB_00148bf2:
        CVar13 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
      }
      else {
        pXVar39 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar29);
        uVar11 = i2d_X509_PUBKEY(pXVar39,(uchar **)0x0);
        if ((int)uVar11 < 1) goto LAB_00148bf2;
        puVar31 = (uchar *)CRYPTO_malloc(uVar11,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/lib/vtls/openssl.c"
                                         ,0xa45);
        local_238._0_1_ = (char)puVar31;
        local_238._1_7_ = (undefined7)((ulong)puVar31 >> 8);
        if (puVar31 == (uchar *)0x0) goto LAB_00148bf2;
        pXVar39 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar29);
        uVar12 = i2d_X509_PUBKEY(pXVar39,(uchar **)&local_238);
        if ((CONCAT71(local_238._1_7_,(char)local_238) - (long)puVar31 != (ulong)uVar11 ||
            uVar11 != uVar12) || CONCAT71(local_238._1_7_,(char)local_238) == 0) {
          CRYPTO_free(puVar31);
          goto LAB_00148bf2;
        }
        CVar13 = Curl_pin_peer_pubkey(local_330,pcVar43,puVar31,(ulong)uVar11);
        CRYPTO_free(puVar31);
        if (CVar13 == CURLE_OK) {
          CVar13 = CURLE_OK;
          pcVar44 = local_340;
          goto LAB_00148c10;
        }
      }
      pcVar44 = local_340;
      Curl_failf(local_330,"SSL: public key does not match pinned public key!");
    }
LAB_00148c10:
    X509_free((X509 *)conn->ssl[lVar46].server_cert);
    conn->ssl[lVar46].server_cert = (X509 *)0x0;
    conn->ssl[lVar46].connecting_state = ssl_connect_done;
  }
  if (CVar13 != CURLE_OK) {
    return CVar13;
  }
  goto LAB_0014680a;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  long timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_ready(readfd, writefd, nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      else if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        else {
          /* timeout */
          failf(data, "SSL connection timeout");
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}